

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
llb_buildsystem_command_interface_spawn::ForwardingProcessDelegate::processFinished(llbuild::basic::
ProcessContext*,llbuild::basic::ProcessHandle,llbuild::basic::ProcessResult_const__
          (void *this,ProcessContext *ctx,ProcessHandle handle,ProcessResult *result)

{
  llb_buildsystem_command_result_t local_50;
  undefined4 local_4c;
  llb_buildsystem_command_extended_result_t res;
  ProcessResult *result_local;
  ProcessContext *ctx_local;
  ForwardingProcessDelegate *this_local;
  ProcessHandle handle_local;
  
  if (*(long *)((long)this + 8) != 0) {
    res._32_8_ = result;
    local_50 = anon_unknown.dwarf_1b8a13::get_command_result(result->status);
    local_4c = *(undefined4 *)(res._32_8_ + 4);
    res.maxrss._0_4_ = *(undefined4 *)(res._32_8_ + 8);
    res._0_8_ = *(undefined8 *)(res._32_8_ + 0x10);
    res.utime = *(uint64_t *)(res._32_8_ + 0x18);
    res.stime = *(uint64_t *)(res._32_8_ + 0x20);
    (**(code **)(*(long *)((long)this + 8) + 0x20))(**(undefined8 **)((long)this + 8),&local_50);
  }
  return;
}

Assistant:

virtual void processFinished(ProcessContext* ctx, ProcessHandle handle,
                                 const ProcessResult& result) {
      if (delegate != NULL) {
        llb_buildsystem_command_extended_result_t res;
        res.result = get_command_result(result.status);
        res.exit_status = result.exitCode;
        res.pid = result.pid;
        res.utime = result.utime;
        res.stime = result.stime;
        res.maxrss = result.maxrss;
        delegate->process_finished(delegate->context, &res);
      }
    }